

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

int __thiscall lf::geometry::Parallelogram::init(Parallelogram *this,EVP_PKEY_CTX *ctx)

{
  Matrix<double,__1,_2,_0,__1,_2> *this_00;
  Matrix<double,__1,_4,_0,__1,_4> *pMVar1;
  double *pdVar2;
  Index IVar3;
  long lVar4;
  double *pdVar5;
  PointerType pdVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar7;
  long lVar8;
  ActualDstType actualDst_1;
  Scalar SVar9;
  double dVar10;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  scalar_difference_op<double,_double> local_249;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_248;
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_228;
  Matrix<double,__1,_4,_0,__1,_4> *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  Index local_1f8;
  XprTypeNested local_1e8;
  Matrix<double,__1,_2,_0,__1,_2> *pMStack_1e0;
  Lhs local_1d0;
  undefined1 local_198 [16];
  Matrix<double,_2,_2,_0,_2,_2> local_188;
  double *local_168;
  PointerType pdStack_160;
  variable_if_dynamic<long,__1> local_158;
  undefined8 local_150;
  undefined1 local_118 [16];
  Matrix<double,__1,_2,_0,__1,_2> *pMStack_108;
  Matrix<double,__1,_4,_0,__1,_4> *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  Index local_e8;
  undefined1 local_e0 [24];
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *local_c8;
  Rhs local_68;
  
  this_00 = &this->jacobian_;
  pMVar1 = &this->coords_;
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             local_118,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data + IVar3,IVar3,1);
  local_f8 = 0;
  local_f0 = 1;
  local_e8 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_rows;
  local_100 = pMVar1;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            (&local_228,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data,local_e8,1);
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
  local_210 = pMVar1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_198,(Lhs *)local_118,(Rhs *)&local_228,
                  (scalar_difference_op<double,_double> *)local_e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>>
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_248,this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
              *)local_198);
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_1d0,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data + IVar3 * 3,IVar3,1);
  local_1d0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_1d0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 3;
  local_1d0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_1d0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_68,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data,
             local_1d0.
             super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
             m_outerStride,1);
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_e0,&local_1d0,&local_68,&local_249);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_248,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
              *)local_e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_248);
  if ((this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
      m_rows == 2) {
    local_e0._0_8_ = this_00;
    local_198._0_8_ =
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_> *)
                    local_e0);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&this->jacobian_inverse_gramian_,(SrcXprType *)local_198,
          (assign_op<double,_double> *)local_118);
    SVar9 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::determinant
                      ((MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)this_00);
    this->integrationElement_ = ABS(SVar9);
    iVar7 = extraout_EAX;
  }
  else {
    local_68.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_data =
         (PointerType)this_00;
    Eigen::
    Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>
    ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
               *)local_198,(Lhs *)&local_68,this_00);
    local_1e8.m_matrix = (non_const_type)local_198._0_8_;
    pMStack_1e0 = (Matrix<double,__1,_2,_0,__1,_2> *)local_198._8_8_;
    local_228.m_data = (PointerType)0x0;
    local_228.m_rows.m_value = 0;
    local_228._16_8_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_228,
               (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
               m_storage.m_rows,2);
    local_118._8_8_ = local_1e8.m_matrix;
    pMStack_108 = pMStack_1e0;
    local_198._0_8_ = this_00;
    local_118._0_8_ = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_188,(SrcXprType *)(local_118 + 8),(assign_op<double,_double> *)local_e0);
    local_168 = (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_198._0_8_)->
                m_storage).m_data;
    pdStack_160 = (PointerType)
                  (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_198._0_8_)->
                  m_storage).m_rows;
    local_150 = 2;
    local_158.m_value = (long)&local_188;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>,Eigen::Matrix<double,_1,2,0,_1,2>,0>>,1>,double,double>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&local_228,
               (Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>,_1>
                *)local_118,(assign_op<double,_double> *)&local_248);
    local_1d0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_data =
         local_228.m_data;
    local_1d0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_rows.
    m_value = local_228.m_rows.m_value;
    local_e0._0_8_ = &local_1d0;
    local_e0._8_8_ =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
          *)local_198;
    local_e0._16_8_ = &local_248;
    local_c8 = &local_228;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_e0);
    pdVar6 = local_228.m_data;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
              (&this->jacobian_inverse_gramian_,(Matrix<double,__1,__1,_0,__1,__1> *)&local_228,
               (assign_op<double,_double> *)local_198);
    lVar4 = (this->jacobian_inverse_gramian_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows;
    if (0 < lVar4) {
      pdVar5 = (this->jacobian_inverse_gramian_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data;
      lVar8 = 0;
      do {
        dVar10 = (pdVar6 + lVar8)[1];
        pdVar2 = pdVar5 + lVar8;
        *pdVar2 = pdVar6[lVar8];
        pdVar2[1] = dVar10;
        lVar8 = lVar8 + 2;
      } while (SBORROW8(lVar8,lVar4 * 2) != lVar8 + lVar4 * -2 < 0);
    }
    free(local_228.m_data);
    local_118._0_8_ = this_00;
    Eigen::
    Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>
    ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
               *)local_198,(Lhs *)local_118,this_00);
    local_e0._0_8_ = local_198._0_8_;
    local_e0._8_8_ = local_198._8_8_;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,2,0,-1,2>>,Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,2,2,0,2,2>>
              ((Matrix<double,_2,_2,_0,_2,_2> *)local_198,
               (Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_e0,
               (Matrix<double,__1,_2,_0,__1,_2> *)local_198._8_8_);
    dVar10 = (double)local_198._0_8_ *
             local_188.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
             .array[1] -
             local_188.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
             .array[0] * (double)local_198._8_8_;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
      iVar7 = extraout_EAX_01;
    }
    else {
      dVar10 = SQRT(dVar10);
      iVar7 = extraout_EAX_00;
    }
    this->integrationElement_ = dVar10;
  }
  return iVar7;
}

Assistant:

void Parallelogram::init() {
  jacobian_ << coords_.col(1) - coords_.col(0), coords_.col(3) - coords_.col(0);
  // Distinguish between different world dimensions
  if (coords_.rows() == 2) {
    // 2D case: Simpler formula!
    jacobian_inverse_gramian_ = jacobian_.transpose().inverse();
    integrationElement_ = std::abs(jacobian_.determinant());
  } else {
    // 3D case: complicated formula
    jacobian_inverse_gramian_ = Eigen::MatrixXd(
        jacobian_ * (jacobian_.transpose() * jacobian_).inverse());
    integrationElement_ =
        std::sqrt((jacobian_.transpose() * jacobian_).determinant());
  }
}